

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_line_table_reader_common.h
# Opt level: O2

int read_uword_de(Dwarf_Small **lp,Dwarf_Unsigned *out_p,Dwarf_Debug dbg,Dwarf_Error *err,
                 Dwarf_Small *lpend)

{
  Dwarf_Small *leb128;
  int iVar1;
  Dwarf_Unsigned lu_local;
  Dwarf_Unsigned lu_leblen;
  
  leb128 = *lp;
  lu_leblen = 0;
  lu_local = 0;
  iVar1 = dwarf_decode_leb128((char *)leb128,&lu_leblen,&lu_local,(char *)lpend);
  if (iVar1 != 1) {
    *lp = leb128 + lu_leblen;
    *out_p = lu_local;
  }
  else {
    _dwarf_error_string(dbg,err,0x149,"DW_DLE_LEB_IMPROPER: decode uleb runs past allowed area.c");
  }
  return (uint)(iVar1 == 1);
}

Assistant:

static int
read_uword_de(Dwarf_Small **lp,
    Dwarf_Unsigned *out_p,
    Dwarf_Debug dbg,
    Dwarf_Error *err,
    Dwarf_Small *lpend)
{
    Dwarf_Small *inptr = *lp;
    Dwarf_Unsigned out = 0;
    DECODE_LEB128_UWORD_CK(inptr,
        out,
        dbg,err,lpend);
    *lp = inptr;
    *out_p = out;
    return DW_DLV_OK;
}